

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::dotSI16x8toI32x4(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  bool bVar1;
  ulong uVar2;
  Literal *val;
  bool bVar3;
  long lVar4;
  Type *this_00;
  undefined1 local_238 [8];
  LaneArray<4UL_*_2UL> lhs;
  LaneArray<4UL_*_2UL> rhs;
  LaneArray<4UL> result;
  anon_union_16_5_9943fe1e_for_Literal_0 local_48;
  undefined8 local_38;
  
  getLanes<short,8>((LaneArray<8> *)local_238,(wasm *)this,other);
  getLanes<short,8>((LaneArray<8> *)&lhs._M_elems[7].type,(wasm *)other,val);
  result._M_elems[3].field_0.i64 = 0;
  result._M_elems[3].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[2].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[2].type.id = 0;
  result._M_elems[1].type.id = 0;
  result._M_elems[2].field_0.i64 = 0;
  result._M_elems[1].field_0.i64 = 0;
  result._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[0].type.id = 0;
  rhs._M_elems[7].type.id = 0;
  result._M_elems[0].field_0.i64 = 0;
  lVar4 = 0;
  do {
    local_48.i32 = 0;
    local_38 = 2;
    this_00 = &result._M_elems[lVar4 + -1].type;
    if ((anon_union_16_5_9943fe1e_for_Literal_0 *)this_00 != &local_48) {
      ~Literal((Literal *)this_00);
      Literal((Literal *)this_00,(Literal *)&local_48.func);
    }
    ~Literal((Literal *)&local_48.func);
    uVar2 = 0;
    bVar1 = true;
    do {
      bVar3 = bVar1;
      if (((result._M_elems[lVar4].field_0.func.super_IString.str._M_str != (char *)0x2) ||
          (uVar2 = uVar2 | lVar4 * 2,
          lhs._M_elems[uVar2].field_0.func.super_IString.str._M_str != (char *)0x2)) ||
         (rhs._M_elems[uVar2].field_0.func.super_IString.str._M_str != (char *)0x2)) {
        __assert_fail("type == Type::i32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                      ,0x118,"int32_t wasm::Literal::geti32() const");
      }
      local_48.i32 = (int)rhs._M_elems[uVar2 - 1].type.id * (int)lhs._M_elems[uVar2 - 1].type.id +
                     (int)this_00->id;
      local_38 = 2;
      if ((anon_union_16_5_9943fe1e_for_Literal_0 *)this_00 != &local_48) {
        ~Literal((Literal *)this_00);
        Literal((Literal *)this_00,(Literal *)&local_48.func);
      }
      ~Literal((Literal *)&local_48.func);
      uVar2 = 1;
      bVar1 = false;
    } while (bVar3);
    lVar4 = lVar4 + 1;
    if (lVar4 == 4) {
      Literal(__return_storage_ptr__,(LaneArray<4> *)&rhs._M_elems[7].type);
      lVar4 = 0x48;
      do {
        ~Literal((Literal *)((long)result._M_elems + lVar4 + -8));
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != -0x18);
      lVar4 = 0xa8;
      do {
        ~Literal((Literal *)((long)rhs._M_elems + lVar4 + -8));
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != -0x18);
      lVar4 = 0xa8;
      do {
        ~Literal((Literal *)(local_238 + lVar4));
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != -0x18);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Literal Literal::dotSI16x8toI32x4(const Literal& other) const {
  return dot<4, 2, &Literal::getLanesSI16x8>(*this, other);
}